

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O1

void Service_GetEndpoints
               (UA_Server *server,UA_Session *session,UA_GetEndpointsRequest *request,
               UA_GetEndpointsResponse *response)

{
  size_t *psVar1;
  size_t __n;
  UA_Byte *__s1;
  UA_Byte *__s2;
  long lVar2;
  undefined1 *__s;
  UA_GetEndpointsRequest *src;
  UA_GetEndpointsResponse *pUVar3;
  UA_GetEndpointsResponse *pUVar4;
  int iVar5;
  UA_StatusCode UVar6;
  UA_EndpointDescription *pUVar7;
  size_t sVar8;
  ulong uVar9;
  long lVar10;
  size_t sVar11;
  UA_EndpointDescription *pUVar12;
  long lVar13;
  size_t sVar14;
  UA_Server *pUVar15;
  undefined8 uStack_90;
  undefined1 auStack_88 [8];
  UA_Server *local_80;
  size_t local_78;
  undefined1 *local_70;
  size_t local_68;
  size_t local_60;
  UA_EndpointDescription *local_58;
  UA_EndpointDescription *local_50;
  UA_GetEndpointsRequest *local_48;
  UA_GetEndpointsResponse *local_40;
  size_t local_38;
  
  local_78 = (request->endpointUrl).length;
  sVar11 = server->endpointDescriptionsSize;
  lVar2 = -(sVar11 + 0xf & 0xfffffffffffffff0);
  local_70 = auStack_88 + lVar2;
  local_40 = response;
  *(undefined8 *)((long)&uStack_90 + lVar2) = 0x11dda8;
  memset(auStack_88 + lVar2,0,sVar11);
  __s = local_70;
  local_68 = request->profileUrisSize;
  local_80 = server;
  local_48 = request;
  if (local_68 == 0) {
    local_38 = sVar11;
    if (sVar11 != 0) {
      *(undefined8 *)((long)&uStack_90 + lVar2) = 0x11de6e;
      memset(__s,1,sVar11);
    }
  }
  else if (sVar11 == 0) {
    local_38 = 0;
  }
  else {
    local_50 = server->endpointDescriptions;
    local_58 = (UA_EndpointDescription *)&request->profileUris->data;
    sVar14 = 0;
    local_38 = 0;
    local_60 = sVar11;
    do {
      pUVar12 = local_50;
      sVar11 = local_50[sVar14].transportProfileUri.length;
      sVar8 = local_68;
      pUVar7 = local_58;
      do {
        __n = *(size_t *)&pUVar7[-1].securityLevel;
        if (__n == sVar11) {
          __s1 = (UA_Byte *)(pUVar7->endpointUrl).length;
          __s2 = pUVar12[sVar14].transportProfileUri.data;
          *(undefined8 *)((long)&uStack_90 + lVar2) = 0x11de2e;
          iVar5 = bcmp(__s1,__s2,__n);
          if (iVar5 == 0) {
            local_70[sVar14] = 1;
            local_38 = local_38 + 1;
            break;
          }
        }
        pUVar7 = (UA_EndpointDescription *)&pUVar7->server;
        sVar8 = sVar8 - 1;
      } while (sVar8 != 0);
      sVar14 = sVar14 + 1;
    } while (sVar14 != local_60);
  }
  pUVar3 = local_40;
  pUVar15 = local_80;
  if (local_38 == 0) {
    local_40->endpointsSize = 0;
  }
  else {
    pUVar7 = (UA_EndpointDescription *)0x1;
    pUVar12 = (UA_EndpointDescription *)0x1;
    if (local_78 == 0) {
      pUVar12 = (UA_EndpointDescription *)(local_80->config).networkLayersSize;
    }
    sVar11 = local_38 * (long)pUVar12;
    if (sVar11 != 0) {
      *(undefined8 *)((long)&uStack_90 + lVar2) = 0x11dec2;
      pUVar7 = (UA_EndpointDescription *)calloc(sVar11,0xd8);
    }
    pUVar4 = local_40;
    pUVar3->endpoints = pUVar7;
    if (pUVar7 == (UA_EndpointDescription *)0x0) {
      (pUVar3->responseHeader).serviceResult = 0x80030000;
    }
    else {
      pUVar3->endpointsSize = sVar11;
      if (pUVar12 == (UA_EndpointDescription *)0x0) {
        UVar6 = 0;
      }
      else {
        local_48 = (UA_GetEndpointsRequest *)&local_48->endpointUrl;
        pUVar7 = (UA_EndpointDescription *)0x0;
        UVar6 = 0;
        lVar10 = 0;
        local_50 = pUVar12;
        do {
          if (local_78 == 0) {
            local_48 = (UA_GetEndpointsRequest *)
                       &(pUVar15->config).networkLayers[(long)pUVar7].discoveryUrl;
          }
          local_58 = pUVar7;
          if (pUVar15->endpointDescriptionsSize != 0) {
            lVar13 = 0;
            uVar9 = 0;
            do {
              if (local_70[uVar9] == '\x01') {
                pUVar12 = pUVar15->endpointDescriptions;
                pUVar7 = pUVar4->endpoints;
                local_68 = CONCAT44(local_68._4_4_,UVar6);
                *(undefined8 *)((long)&uStack_90 + lVar2) = 0x11df58;
                UVar6 = UA_copy((void *)((long)&(pUVar12->endpointUrl).length + lVar13),
                                pUVar7 + lVar10,UA_TYPES + 0x9b);
                src = local_48;
                local_60 = CONCAT44(local_60._4_4_,UVar6);
                pUVar12 = pUVar4->endpoints;
                *(undefined8 *)((long)&uStack_90 + lVar2) = 0x11df76;
                UVar6 = UA_copy(src,pUVar12 + lVar10,UA_TYPES + 0xb);
                UVar6 = (uint)local_68 | UVar6 | (uint)local_60;
                lVar10 = lVar10 + 1;
                pUVar15 = local_80;
              }
              uVar9 = uVar9 + 1;
              lVar13 = lVar13 + 0xd8;
            } while (uVar9 < pUVar15->endpointDescriptionsSize);
          }
          pUVar7 = (UA_EndpointDescription *)((long)&(local_58->endpointUrl).length + 1);
        } while (pUVar7 != local_50);
      }
      pUVar3 = local_40;
      if (UVar6 != 0) {
        psVar1 = &local_40->endpointsSize;
        (local_40->responseHeader).serviceResult = UVar6;
        sVar8 = local_40->endpointsSize;
        pUVar12 = local_40->endpoints;
        *(undefined8 *)((long)&uStack_90 + lVar2) = 0x11dff6;
        UA_Array_delete(pUVar12,sVar8,UA_TYPES + 0x9b);
        *psVar1 = 0;
        pUVar3->endpoints = (UA_EndpointDescription *)0x0;
      }
    }
  }
  return;
}

Assistant:

void Service_GetEndpoints(UA_Server *server, UA_Session *session, const UA_GetEndpointsRequest *request,
                          UA_GetEndpointsResponse *response) {
    /* If the client expects to see a specific endpointurl, mirror it back. If
       not, clone the endpoints with the discovery url of all networklayers. */
    const UA_String *endpointUrl = &request->endpointUrl;
    if(endpointUrl->length > 0) {
        UA_LOG_DEBUG_SESSION(server->config.logger, session, "Processing GetEndpointsRequest with endpointUrl " \
                             UA_PRINTF_STRING_FORMAT, UA_PRINTF_STRING_DATA(*endpointUrl));
    } else {
        UA_LOG_DEBUG_SESSION(server->config.logger, session, "Processing GetEndpointsRequest with an empty endpointUrl");
    }

    /* test if the supported binary profile shall be returned */
#ifdef NO_ALLOCA
    UA_Boolean relevant_endpoints[server->endpointDescriptionsSize];
#else
    UA_Boolean *relevant_endpoints = UA_alloca(sizeof(UA_Boolean) * server->endpointDescriptionsSize);
#endif
    memset(relevant_endpoints, 0, sizeof(UA_Boolean) * server->endpointDescriptionsSize);
    size_t relevant_count = 0;
    if(request->profileUrisSize == 0) {
        for(size_t j = 0; j < server->endpointDescriptionsSize; ++j)
            relevant_endpoints[j] = true;
        relevant_count = server->endpointDescriptionsSize;
    } else {
        for(size_t j = 0; j < server->endpointDescriptionsSize; ++j) {
            for(size_t i = 0; i < request->profileUrisSize; ++i) {
                if(!UA_String_equal(&request->profileUris[i], &server->endpointDescriptions[j].transportProfileUri))
                    continue;
                relevant_endpoints[j] = true;
                ++relevant_count;
                break;
            }
        }
    }

    if(relevant_count == 0) {
        response->endpointsSize = 0;
        return;
    }

    /* Clone the endpoint for each networklayer? */
    size_t clone_times = 1;
    UA_Boolean nl_endpointurl = false;
    if(endpointUrl->length == 0) {
        clone_times = server->config.networkLayersSize;
        nl_endpointurl = true;
    }

    response->endpoints = UA_Array_new(relevant_count * clone_times, &UA_TYPES[UA_TYPES_ENDPOINTDESCRIPTION]);
    if(!response->endpoints) {
        response->responseHeader.serviceResult = UA_STATUSCODE_BADOUTOFMEMORY;
        return;
    }
    response->endpointsSize = relevant_count * clone_times;

    size_t k = 0;
    UA_StatusCode retval = UA_STATUSCODE_GOOD;
    for(size_t i = 0; i < clone_times; ++i) {
        if(nl_endpointurl)
            endpointUrl = &server->config.networkLayers[i].discoveryUrl;
        for(size_t j = 0; j < server->endpointDescriptionsSize; ++j) {
            if(!relevant_endpoints[j])
                continue;
            retval |= UA_EndpointDescription_copy(&server->endpointDescriptions[j], &response->endpoints[k]);
            retval |= UA_String_copy(endpointUrl, &response->endpoints[k].endpointUrl);
            ++k;
        }
    }

    if(retval != UA_STATUSCODE_GOOD) {
        response->responseHeader.serviceResult = retval;
        UA_Array_delete(response->endpoints, response->endpointsSize, &UA_TYPES[UA_TYPES_ENDPOINTDESCRIPTION]);
        response->endpoints = NULL;
        response->endpointsSize = 0;
        return;
    }
}